

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

Value * __thiscall
wabt::Decompiler::WrapBinary
          (Value *__return_storage_ptr__,Decompiler *this,
          vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *args,
          string_view infix,bool indent_right,Precedence precedence)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  unsigned_long val;
  size_type sVar1;
  size_type sVar2;
  size_t sVar3;
  size_t sVar4;
  reference pvVar5;
  const_pointer pcVar6;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __result;
  char *pcVar7;
  string_view y;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  string_view local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_100;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  undefined1 local_ca;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c9;
  Decompiler *local_c8;
  char *local_c0;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  iterator local_78;
  size_type local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  ulong local_50;
  unsigned_long width;
  value_type *right;
  value_type *left;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *pvStack_30;
  bool indent_right_local;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *args_local;
  Decompiler *this_local;
  string_view infix_local;
  Value *bin;
  
  pcVar7 = (char *)infix.size_;
  this_local = (Decompiler *)infix.data_;
  left._7_1_ = indent_right;
  pvStack_30 = args;
  args_local = (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)this;
  infix_local.data_ = pcVar7;
  infix_local.size_ = (size_type)__return_storage_ptr__;
  sVar1 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::size(args)
  ;
  if (sVar1 == 2) {
    right = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
            operator[](pvStack_30,0);
    width = (unsigned_long)
            std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
            operator[](pvStack_30,1);
    BracketIfNeeded(this,right,precedence);
    BracketIfNeeded(this,(Value *)width,precedence);
    sVar2 = string_view::size((string_view *)&this_local);
    sVar3 = Value::width(right);
    sVar4 = Value::width((Value *)width);
    local_50 = sVar2 + sVar3 + sVar4;
    if (((local_50 < this->target_exp_width) &&
        (sVar1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&right->v), sVar1 == 1)) &&
       (sVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)width), sVar1 == 1)) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&right->v,0);
      local_c8 = this_local;
      local_c0 = infix_local.data_;
      y.size_ = (size_type)pcVar7;
      y.data_ = infix_local.data_;
      wabt::operator+(&local_b8,(wabt *)pvVar5,(string *)this_local,y);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)width,0);
      std::operator+(&local_98,&local_b8,pvVar5);
      local_78 = &local_98;
      local_70 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_c9);
      __l._M_len = local_70;
      __l._M_array = local_78;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_68,__l,&local_c9);
      Value::Value(__return_storage_ptr__,&local_68,precedence);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_c9);
      local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78;
      do {
        local_168 = local_168 + -1;
        std::__cxx11::string::~string((string *)local_168);
      } while (local_168 != &local_98);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    else {
      local_ca = 0;
      memset(&local_e8,0,0x18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_e8);
      Value::Value(__return_storage_ptr__,&local_e8,precedence);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e8);
      local_f0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&right->v);
      local_f8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&right->v);
      local_100 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)std::
                     back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                               (&__return_storage_ptr__->v);
      local_108 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)std::
                     move<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                               (local_f0,local_f8,
                                (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 )local_100);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(&__return_storage_ptr__->v);
      pcVar6 = string_view::data((string_view *)&this_local);
      string_view::size((string_view *)&this_local);
      std::__cxx11::string::append((char *)pvVar5,(ulong)pcVar6);
      val = width;
      if ((left._7_1_ & 1) != 0) {
        sVar3 = this->indent_amount;
        string_view::string_view(&local_118);
        IndentValue(this,(Value *)val,sVar3,local_118);
      }
      __first = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)width);
      __last = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)width);
      __result = std::
                 back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           (&__return_storage_ptr__->v);
      std::
      move<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__first._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__last._M_current,__result);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("args.size() == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/decompiler.cc"
                ,0x93,
                "Value wabt::Decompiler::WrapBinary(std::vector<Value> &, string_view, bool, Precedence)"
               );
}

Assistant:

Value WrapBinary(std::vector<Value>& args, string_view infix,
                   bool indent_right, Precedence precedence) {
    assert(args.size() == 2);
    auto& left = args[0];
    auto& right = args[1];
    BracketIfNeeded(left, precedence);
    BracketIfNeeded(right, precedence);
    auto width = infix.size() + left.width() + right.width();
    if (width < target_exp_width && left.v.size() == 1 && right.v.size() == 1) {
      return Value{{left.v[0] + infix + right.v[0]}, precedence};
    } else {
      Value bin { {}, precedence };
      std::move(left.v.begin(), left.v.end(), std::back_inserter(bin.v));
      bin.v.back().append(infix.data(), infix.size());
      if (indent_right) IndentValue(right, indent_amount, {});
      std::move(right.v.begin(), right.v.end(), std::back_inserter(bin.v));
      return bin;
    }
  }